

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestVC.cxx
# Opt level: O3

bool __thiscall cmCTestVC::WriteXML(cmCTestVC *this,cmXMLWriter *xml)

{
  int iVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(this->Log,"--- Begin Revisions ---\n",0x18);
  iVar1 = (*this->_vptr_cmCTestVC[6])(this,xml);
  std::__ostream_insert<char,std::char_traits<char>>(this->Log,"--- End Revisions ---\n",0x16);
  return SUB41(iVar1,0);
}

Assistant:

bool cmCTestVC::WriteXML(cmXMLWriter& xml)
{
  this->Log << "--- Begin Revisions ---\n";
  bool result = this->WriteXMLUpdates(xml);
  this->Log << "--- End Revisions ---\n";
  return result;
}